

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.h
# Opt level: O2

size_t __thiscall LdConfigDirWrapper::getFieldsCount(LdConfigDirWrapper *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  offset_t oVar3;
  size_t sVar4;
  size_t fId;
  
  iVar1 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xd])();
  iVar2 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
            [0xb])();
  oVar3 = 0xffffffffffffffff;
  sVar4 = 0x2e;
  do {
    fId = sVar4;
    if (fId == 0) break;
    oVar3 = _getFieldDelta(iVar2 == 0x20,fId);
    sVar4 = fId - 1;
  } while (CONCAT44(extraout_var,iVar1) <= oVar3);
  sVar4 = fId + 1;
  if (CONCAT44(extraout_var,iVar1) < oVar3) {
    sVar4 = 0;
  }
  if (oVar3 == 0xffffffffffffffff) {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

virtual size_t getFieldsCount()
    {
        const offset_t realSize = getSize();
        const bool is32b = (m_Exe->getBitMode() == Executable::BITS_32) ? true : false;
        size_t fId = FIELD_COUNTER - 1;
        offset_t fieldDelta = INVALID_ADDR;
        for (; fId != 0; fId--) {
            fieldDelta = _getFieldDelta(is32b, fId);
            if (fieldDelta < realSize) break;
        }
        if ((fieldDelta == INVALID_ADDR) || (fieldDelta > realSize)) {
            return 0;
        }
        return (fId + 1);
    }